

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O0

void __thiscall
flatbuffers::python::PythonGenerator::GetScalarFieldOfStruct
          (PythonGenerator *this,StructDef *struct_def,FieldDef *field,string *code_ptr)

{
  string local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  string local_80;
  undefined1 local_50 [8];
  string getter;
  string *code;
  string *code_ptr_local;
  FieldDef *field_local;
  StructDef *struct_def_local;
  PythonGenerator *this_local;
  
  getter.field_2._8_8_ = code_ptr;
  GenGetter_abi_cxx11_((string *)local_50,this,&(field->value).type);
  GenReceiver(this,struct_def,code_ptr);
  Namer::Method<flatbuffers::FieldDef>(&local_80,&(this->namer_).super_Namer,field);
  std::__cxx11::string::operator+=((string *)getter.field_2._8_8_,(string *)&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::operator+(&local_a0,"(self): return ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
  std::__cxx11::string::operator+=((string *)getter.field_2._8_8_,(string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::operator+=
            ((string *)getter.field_2._8_8_,
             "self._tab.Pos + flatbuffers.number_types.UOffsetTFlags.py_type(");
  NumToString<unsigned_short>(&local_e0,(field->value).offset);
  std::operator+(&local_c0,&local_e0,"))\n");
  std::__cxx11::string::operator+=((string *)getter.field_2._8_8_,(string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)local_50);
  return;
}

Assistant:

void GetScalarFieldOfStruct(const StructDef &struct_def,
                              const FieldDef &field,
                              std::string *code_ptr) const {
    auto &code = *code_ptr;
    std::string getter = GenGetter(field.value.type);
    GenReceiver(struct_def, code_ptr);
    code += namer_.Method(field);
    code += "(self): return " + getter;
    code += "self._tab.Pos + flatbuffers.number_types.UOffsetTFlags.py_type(";
    code += NumToString(field.value.offset) + "))\n";
  }